

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O3

bool google::protobuf::util::anon_unknown_0::FieldInOneof
               (Type *type,string_view name,string_view oneof_name)

{
  int iVar1;
  Field *pFVar2;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar3;
  string_view name_00;
  
  name_00._M_str = (char *)oneof_name._M_len;
  name_00._M_len = name._M_str;
  pFVar2 = FindField((anon_unknown_0 *)type,(Type *)name._M_len,name_00);
  if (pFVar2 != (Field *)0x0) {
    iVar1 = (pFVar2->field_0)._impl_.oneof_index_;
    if (iVar1 < 1) {
      return false;
    }
    if (*(int *)((long)&type->field_0 + 0x28) < iVar1) {
      return false;
    }
    pVVar3 = protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                       (&(type->field_0)._impl_.oneofs_.super_RepeatedPtrFieldBase,iVar1 + -1);
    if (((char *)pVVar3->_M_string_length == name_00._M_str) &&
       ((name_00._M_str == (char *)0x0 ||
        (iVar1 = bcmp((pVVar3->_M_dataplus)._M_p,oneof_name._M_str,(size_t)name_00._M_str),
        iVar1 == 0)))) {
      return true;
    }
  }
  return false;
}

Assistant:

bool FieldInOneof(const Type& type, absl::string_view name,
                  absl::string_view oneof_name) {
  const Field* field = FindField(type, name);
  if (field == nullptr || field->oneof_index() <= 0 ||
      field->oneof_index() > type.oneofs_size()) {
    return false;
  }
  return type.oneofs(field->oneof_index() - 1) == oneof_name;
}